

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  Ref<embree::Geometry> *pRVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  int iVar17;
  undefined4 uVar18;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar48;
  uint uVar49;
  vint4 bi;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint uVar50;
  undefined1 auVar47 [16];
  vint4 bi_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  float fVar54;
  float fVar61;
  float fVar62;
  vint4 ai;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar63;
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined1 local_10b8 [16];
  undefined4 local_10a8;
  undefined4 uStack_10a4;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined4 local_1068;
  undefined4 uStack_1064;
  undefined4 uStack_1060;
  undefined4 uStack_105c;
  undefined4 local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_fe8 [16];
  float local_fd8 [4];
  float local_fc8 [4];
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar19;
  
  pauVar26 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar30._4_4_ = fVar3;
  auVar30._0_4_ = fVar3;
  auVar30._8_4_ = fVar3;
  auVar30._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar31._4_4_ = fVar4;
  auVar31._0_4_ = fVar4;
  auVar31._8_4_ = fVar4;
  auVar31._12_4_ = fVar4;
  fVar54 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar32._4_4_ = fVar54;
  auVar32._0_4_ = fVar54;
  auVar32._8_4_ = fVar54;
  auVar32._12_4_ = fVar54;
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar54 = fVar54 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar17 = (tray->tfar).field_0.i[k];
  auVar53 = ZEXT1664(CONCAT412(iVar17,CONCAT48(iVar17,CONCAT44(iVar17,iVar17))));
  auVar41._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar41._8_4_ = -fVar3;
  auVar41._12_4_ = -fVar3;
  auVar42._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar42._8_4_ = -fVar4;
  auVar42._12_4_ = -fVar4;
  local_10a8 = 0x80000000;
  uStack_10a4 = 0x80000000;
  uStack_10a0 = 0x80000000;
  uStack_109c = 0x80000000;
  auVar43._0_8_ = CONCAT44(fVar54,fVar54) ^ 0x8000000080000000;
  auVar43._8_4_ = -fVar54;
  auVar43._12_4_ = -fVar54;
  iVar17 = (tray->tnear).field_0.i[k];
  auVar44._4_4_ = iVar17;
  auVar44._0_4_ = iVar17;
  auVar44._8_4_ = iVar17;
  auVar44._12_4_ = iVar17;
LAB_004f450a:
  do {
    pauVar1 = pauVar26 + -1;
    pauVar26 = pauVar26 + -1;
    if (*(float *)(*pauVar1 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar29 = *(ulong *)*pauVar26;
      while ((uVar29 & 8) == 0) {
        auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar29 + 0x20 + uVar20),auVar41,auVar30);
        auVar45 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar29 + 0x20 + uVar23),auVar42,auVar31);
        auVar33 = vpmaxsd_avx(auVar33,auVar45);
        auVar45 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar29 + 0x20 + uVar24),auVar43,auVar32);
        auVar45 = vpmaxsd_avx(auVar45,auVar44);
        local_1038 = vpmaxsd_avx(auVar33,auVar45);
        auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar29 + 0x20 + (uVar20 ^ 0x10)),auVar41,
                                  auVar30);
        auVar45 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar29 + 0x20 + (uVar23 ^ 0x10)),auVar42,
                                  auVar31);
        auVar33 = vpminsd_avx(auVar33,auVar45);
        auVar45 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar29 + 0x20 + (uVar24 ^ 0x10)),auVar43,
                                  auVar32);
        auVar45 = vpminsd_avx(auVar45,auVar53._0_16_);
        auVar33 = vpminsd_avx(auVar33,auVar45);
        auVar33 = vpcmpgtd_avx(local_1038,auVar33);
        iVar17 = vmovmskps_avx(auVar33);
        if (iVar17 == 0xf) {
          if (pauVar26 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          goto LAB_004f450a;
        }
        bVar16 = (byte)iVar17 ^ 0xf;
        uVar27 = uVar29 & 0xfffffffffffffff0;
        lVar28 = 0;
        for (uVar29 = (ulong)bVar16; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          lVar28 = lVar28 + 1;
        }
        uVar29 = *(ulong *)(uVar27 + lVar28 * 8);
        uVar21 = bVar16 - 1 & (uint)bVar16;
        uVar19 = (ulong)uVar21;
        if (uVar21 != 0) {
          uVar48 = *(uint *)(local_1038 + lVar28 * 4);
          lVar28 = 0;
          for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar28 = lVar28 + 1;
          }
          uVar21 = uVar21 - 1 & uVar21;
          uVar25 = (ulong)uVar21;
          uVar19 = *(ulong *)(uVar27 + lVar28 * 8);
          uVar49 = *(uint *)(local_1038 + lVar28 * 4);
          if (uVar21 == 0) {
            if (uVar48 < uVar49) {
              *(ulong *)*pauVar26 = uVar19;
              *(uint *)(*pauVar26 + 8) = uVar49;
              pauVar26 = pauVar26 + 1;
            }
            else {
              *(ulong *)*pauVar26 = uVar29;
              *(uint *)(*pauVar26 + 8) = uVar48;
              pauVar26 = pauVar26 + 1;
              uVar29 = uVar19;
            }
          }
          else {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar29;
            auVar33 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar48));
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar19;
            auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar49));
            lVar28 = 0;
            for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
            uVar21 = uVar21 - 1 & uVar21;
            uVar29 = (ulong)uVar21;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = *(ulong *)(uVar27 + lVar28 * 8);
            auVar65 = vpunpcklqdq_avx(auVar55,ZEXT416(*(uint *)(local_1038 + lVar28 * 4)));
            auVar55 = vpcmpgtd_avx(auVar45,auVar33);
            if (uVar21 == 0) {
              auVar66 = vpshufd_avx(auVar55,0xaa);
              auVar55 = vblendvps_avx(auVar45,auVar33,auVar66);
              auVar33 = vblendvps_avx(auVar33,auVar45,auVar66);
              auVar45 = vpcmpgtd_avx(auVar65,auVar55);
              auVar66 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar65,auVar55,auVar66);
              auVar55 = vblendvps_avx(auVar55,auVar65,auVar66);
              auVar65 = vpcmpgtd_avx(auVar55,auVar33);
              auVar66 = vpshufd_avx(auVar65,0xaa);
              auVar65 = vblendvps_avx(auVar55,auVar33,auVar66);
              auVar33 = vblendvps_avx(auVar33,auVar55,auVar66);
              *pauVar26 = auVar33;
              pauVar26[1] = auVar65;
              uVar29 = auVar45._0_8_;
              pauVar26 = pauVar26 + 2;
            }
            else {
              lVar28 = 0;
              for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                lVar28 = lVar28 + 1;
              }
              auVar66._8_8_ = 0;
              auVar66._0_8_ = *(ulong *)(uVar27 + lVar28 * 8);
              auVar7 = vpunpcklqdq_avx(auVar66,ZEXT416(*(uint *)(local_1038 + lVar28 * 4)));
              auVar66 = vpshufd_avx(auVar55,0xaa);
              auVar55 = vblendvps_avx(auVar45,auVar33,auVar66);
              auVar33 = vblendvps_avx(auVar33,auVar45,auVar66);
              auVar45 = vpcmpgtd_avx(auVar7,auVar65);
              auVar66 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar7,auVar65,auVar66);
              auVar65 = vblendvps_avx(auVar65,auVar7,auVar66);
              auVar66 = vpcmpgtd_avx(auVar65,auVar33);
              auVar7 = vpshufd_avx(auVar66,0xaa);
              auVar66 = vblendvps_avx(auVar65,auVar33,auVar7);
              auVar33 = vblendvps_avx(auVar33,auVar65,auVar7);
              auVar65 = vpcmpgtd_avx(auVar45,auVar55);
              auVar7 = vpshufd_avx(auVar65,0xaa);
              auVar65 = vblendvps_avx(auVar45,auVar55,auVar7);
              auVar45 = vblendvps_avx(auVar55,auVar45,auVar7);
              auVar55 = vpcmpgtd_avx(auVar66,auVar45);
              auVar7 = vpshufd_avx(auVar55,0xaa);
              auVar55 = vblendvps_avx(auVar66,auVar45,auVar7);
              auVar45 = vblendvps_avx(auVar45,auVar66,auVar7);
              *pauVar26 = auVar33;
              pauVar26[1] = auVar45;
              pauVar26[2] = auVar55;
              uVar29 = auVar65._0_8_;
              pauVar26 = pauVar26 + 3;
            }
          }
        }
      }
      uVar27 = (ulong)((uint)uVar29 & 0xf);
      if (uVar27 != 8) {
        uVar29 = uVar29 & 0xfffffffffffffff0;
        local_1058 = *(undefined4 *)(ray + k * 4);
        local_1068 = *(undefined4 *)(ray + k * 4 + 0x10);
        local_1078 = *(undefined4 *)(ray + k * 4 + 0x20);
        fVar3 = *(float *)(ray + k * 4 + 0x40);
        fVar4 = *(float *)(ray + k * 4 + 0x50);
        local_1088 = *(float *)(ray + k * 4 + 0x60);
        lVar28 = 0;
        fStack_1084 = local_1088;
        fStack_1080 = local_1088;
        fStack_107c = local_1088;
        uStack_1074 = local_1078;
        uStack_1070 = local_1078;
        uStack_106c = local_1078;
        uStack_1064 = local_1068;
        uStack_1060 = local_1068;
        uStack_105c = local_1068;
        uStack_1054 = local_1058;
        uStack_1050 = local_1058;
        uStack_104c = local_1058;
        do {
          lVar22 = lVar28 * 0xb0;
          auVar33 = *(undefined1 (*) [16])(uVar29 + 0x80 + lVar22);
          pauVar1 = (undefined1 (*) [16])(uVar29 + 0x40 + lVar22);
          auVar45 = *(undefined1 (*) [16])(uVar29 + 0x70 + lVar22);
          auVar55 = *(undefined1 (*) [16])(uVar29 + 0x50 + lVar22);
          auVar34._0_4_ = auVar33._0_4_ * *(float *)*pauVar1;
          auVar34._4_4_ = auVar33._4_4_ * *(float *)(*pauVar1 + 4);
          auVar34._8_4_ = auVar33._8_4_ * *(float *)(*pauVar1 + 8);
          auVar34._12_4_ = auVar33._12_4_ * *(float *)(*pauVar1 + 0xc);
          auVar34 = vfmsub231ps_fma(auVar34,auVar45,auVar55);
          pauVar2 = (undefined1 (*) [16])(uVar29 + 0x60 + lVar22);
          auVar8._4_4_ = uStack_1054;
          auVar8._0_4_ = local_1058;
          auVar8._8_4_ = uStack_1050;
          auVar8._12_4_ = uStack_104c;
          auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + lVar22),auVar8);
          auVar7._4_4_ = uStack_1064;
          auVar7._0_4_ = local_1068;
          auVar7._8_4_ = uStack_1060;
          auVar7._12_4_ = uStack_105c;
          auVar7 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x10 + lVar22),auVar7);
          auVar65._4_4_ = uStack_1074;
          auVar65._0_4_ = local_1078;
          auVar65._8_4_ = uStack_1070;
          auVar65._12_4_ = uStack_106c;
          auVar8 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x20 + lVar22),auVar65);
          auVar65 = *(undefined1 (*) [16])(uVar29 + 0x30 + lVar22);
          auVar56._0_4_ = auVar55._0_4_ * *(float *)*pauVar2;
          auVar56._4_4_ = auVar55._4_4_ * *(float *)(*pauVar2 + 4);
          auVar56._8_4_ = auVar55._8_4_ * *(float *)(*pauVar2 + 8);
          auVar56._12_4_ = auVar55._12_4_ * *(float *)(*pauVar2 + 0xc);
          auVar56 = vfmsub231ps_fma(auVar56,auVar33,auVar65);
          auVar11._4_4_ = fVar3;
          auVar11._0_4_ = fVar3;
          auVar11._8_4_ = fVar3;
          auVar11._12_4_ = fVar3;
          auVar57._0_4_ = auVar7._0_4_ * fVar3;
          auVar57._4_4_ = auVar7._4_4_ * fVar3;
          auVar57._8_4_ = auVar7._8_4_ * fVar3;
          auVar57._12_4_ = auVar7._12_4_ * fVar3;
          auVar10._4_4_ = fVar4;
          auVar10._0_4_ = fVar4;
          auVar10._8_4_ = fVar4;
          auVar10._12_4_ = fVar4;
          auVar10 = vfmsub231ps_fma(auVar57,auVar66,auVar10);
          auVar64._0_4_ = auVar33._0_4_ * auVar10._0_4_;
          auVar64._4_4_ = auVar33._4_4_ * auVar10._4_4_;
          auVar64._8_4_ = auVar33._8_4_ * auVar10._8_4_;
          auVar64._12_4_ = auVar33._12_4_ * auVar10._12_4_;
          auVar58._0_4_ = auVar55._0_4_ * auVar10._0_4_;
          auVar58._4_4_ = auVar55._4_4_ * auVar10._4_4_;
          auVar58._8_4_ = auVar55._8_4_ * auVar10._8_4_;
          auVar58._12_4_ = auVar55._12_4_ * auVar10._12_4_;
          auVar12._4_4_ = fStack_1084;
          auVar12._0_4_ = local_1088;
          auVar12._8_4_ = fStack_1080;
          auVar12._12_4_ = fStack_107c;
          auVar46._0_4_ = local_1088 * auVar66._0_4_;
          auVar46._4_4_ = fStack_1084 * auVar66._4_4_;
          auVar46._8_4_ = fStack_1080 * auVar66._8_4_;
          auVar46._12_4_ = fStack_107c * auVar66._12_4_;
          auVar55 = vfmsub231ps_fma(auVar46,auVar8,auVar11);
          auVar33 = vfmadd231ps_fma(auVar64,auVar55,auVar45);
          auVar35._0_4_ = auVar65._0_4_ * auVar45._0_4_;
          auVar35._4_4_ = auVar65._4_4_ * auVar45._4_4_;
          auVar35._8_4_ = auVar65._8_4_ * auVar45._8_4_;
          auVar35._12_4_ = auVar65._12_4_ * auVar45._12_4_;
          auVar11 = vfmsub231ps_fma(auVar35,*pauVar2,*pauVar1);
          auVar45 = vfmadd231ps_fma(auVar58,*pauVar1,auVar55);
          auVar13._4_4_ = fVar4;
          auVar13._0_4_ = fVar4;
          auVar13._8_4_ = fVar4;
          auVar13._12_4_ = fVar4;
          auVar67._0_4_ = fVar4 * auVar8._0_4_;
          auVar67._4_4_ = fVar4 * auVar8._4_4_;
          auVar67._8_4_ = fVar4 * auVar8._8_4_;
          auVar67._12_4_ = fVar4 * auVar8._12_4_;
          auVar12 = vfmsub231ps_fma(auVar67,auVar12,auVar7);
          auVar36._0_4_ = local_1088 * auVar11._0_4_;
          auVar36._4_4_ = fStack_1084 * auVar11._4_4_;
          auVar36._8_4_ = fStack_1080 * auVar11._8_4_;
          auVar36._12_4_ = fStack_107c * auVar11._12_4_;
          auVar55 = vfmadd231ps_fma(auVar36,auVar13,auVar56);
          auVar14._4_4_ = fVar3;
          auVar14._0_4_ = fVar3;
          auVar14._8_4_ = fVar3;
          auVar14._12_4_ = fVar3;
          auVar55 = vfmadd231ps_fma(auVar55,auVar14,auVar34);
          auVar10 = vfmadd231ps_fma(auVar33,auVar12,*pauVar2);
          auVar15._4_4_ = uStack_10a4;
          auVar15._0_4_ = local_10a8;
          auVar15._8_4_ = uStack_10a0;
          auVar15._12_4_ = uStack_109c;
          auVar33 = vandps_avx(auVar55,auVar15);
          uVar21 = auVar33._0_4_;
          local_1038._0_4_ = (float)(uVar21 ^ auVar10._0_4_);
          uVar48 = auVar33._4_4_;
          local_1038._4_4_ = (float)(uVar48 ^ auVar10._4_4_);
          uVar49 = auVar33._8_4_;
          local_1038._8_4_ = (float)(uVar49 ^ auVar10._8_4_);
          uVar50 = auVar33._12_4_;
          local_1038._12_4_ = (float)(uVar50 ^ auVar10._12_4_);
          auVar33 = vfmadd231ps_fma(auVar45,auVar65,auVar12);
          local_1028._0_4_ = (float)(uVar21 ^ auVar33._0_4_);
          local_1028._4_4_ = (float)(uVar48 ^ auVar33._4_4_);
          local_1028._8_4_ = (float)(uVar49 ^ auVar33._8_4_);
          local_1028._12_4_ = (float)(uVar50 ^ auVar33._12_4_);
          auVar65 = ZEXT816(0) << 0x20;
          auVar33 = vcmpps_avx(local_1038,auVar65,5);
          auVar45 = vcmpps_avx(local_1028,auVar65,5);
          auVar33 = vandps_avx(auVar33,auVar45);
          auVar59._8_4_ = 0x7fffffff;
          auVar59._0_8_ = 0x7fffffff7fffffff;
          auVar59._12_4_ = 0x7fffffff;
          local_1008 = vandps_avx(auVar59,auVar55);
          auVar45 = vcmpps_avx(auVar65,auVar55,4);
          auVar33 = vandps_avx(auVar33,auVar45);
          auVar37._0_4_ = local_1038._0_4_ + local_1028._0_4_;
          auVar37._4_4_ = local_1038._4_4_ + local_1028._4_4_;
          auVar37._8_4_ = local_1038._8_4_ + local_1028._8_4_;
          auVar37._12_4_ = local_1038._12_4_ + local_1028._12_4_;
          auVar45 = vcmpps_avx(auVar37,local_1008,2);
          auVar55 = auVar45 & auVar33;
          if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar55[0xf] < '\0') {
            auVar33 = vandps_avx(auVar33,auVar45);
            auVar38._0_4_ = auVar11._0_4_ * auVar8._0_4_;
            auVar38._4_4_ = auVar11._4_4_ * auVar8._4_4_;
            auVar38._8_4_ = auVar11._8_4_ * auVar8._8_4_;
            auVar38._12_4_ = auVar11._12_4_ * auVar8._12_4_;
            auVar45 = vfmadd132ps_fma(auVar7,auVar38,auVar56);
            auVar45 = vfmadd132ps_fma(auVar66,auVar45,auVar34);
            local_1018._0_4_ = (float)(uVar21 ^ auVar45._0_4_);
            local_1018._4_4_ = (float)(uVar48 ^ auVar45._4_4_);
            local_1018._8_4_ = (float)(uVar49 ^ auVar45._8_4_);
            local_1018._12_4_ = (float)(uVar50 ^ auVar45._12_4_);
            fVar54 = *(float *)(ray + k * 4 + 0x30);
            auVar39._0_4_ = local_1008._0_4_ * fVar54;
            auVar39._4_4_ = local_1008._4_4_ * fVar54;
            auVar39._8_4_ = local_1008._8_4_ * fVar54;
            auVar39._12_4_ = local_1008._12_4_ * fVar54;
            auVar45 = vcmpps_avx(auVar39,local_1018,1);
            fVar54 = *(float *)(ray + k * 4 + 0x80);
            auVar47._0_4_ = local_1008._0_4_ * fVar54;
            auVar47._4_4_ = local_1008._4_4_ * fVar54;
            auVar47._8_4_ = local_1008._8_4_ * fVar54;
            auVar47._12_4_ = local_1008._12_4_ * fVar54;
            auVar55 = vcmpps_avx(local_1018,auVar47,2);
            auVar45 = vandps_avx(auVar55,auVar45);
            auVar55 = auVar33 & auVar45;
            if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar55[0xf] < '\0') {
              local_10b8 = vandps_avx(auVar45,auVar33);
              local_fe8 = local_10b8;
              local_1128 = auVar34._0_8_;
              uStack_1120 = auVar34._8_8_;
              local_fa8 = local_1128;
              uStack_fa0 = uStack_1120;
              local_1118 = auVar56._0_8_;
              uStack_1110 = auVar56._8_8_;
              local_f98 = local_1118;
              uStack_f90 = uStack_1110;
              local_10e8 = auVar11._0_8_;
              uStack_10e0 = auVar11._8_8_;
              local_f88 = local_10e8;
              uStack_f80 = uStack_10e0;
              auVar33 = vrcpps_avx(local_1008);
              auVar51._8_4_ = 0x3f800000;
              auVar51._0_8_ = 0x3f8000003f800000;
              auVar51._12_4_ = 0x3f800000;
              auVar45 = vfnmadd213ps_fma(local_1008,auVar33,auVar51);
              auVar33 = vfmadd132ps_fma(auVar45,auVar33,auVar33);
              fVar54 = auVar33._0_4_;
              auVar40._0_4_ = fVar54 * local_1018._0_4_;
              fVar61 = auVar33._4_4_;
              auVar40._4_4_ = fVar61 * local_1018._4_4_;
              fVar62 = auVar33._8_4_;
              auVar40._8_4_ = fVar62 * local_1018._8_4_;
              fVar63 = auVar33._12_4_;
              auVar40._12_4_ = fVar63 * local_1018._12_4_;
              local_fb8 = auVar40;
              local_fd8[0] = fVar54 * local_1038._0_4_;
              local_fd8[1] = fVar61 * local_1038._4_4_;
              local_fd8[2] = fVar62 * local_1038._8_4_;
              local_fd8[3] = fVar63 * local_1038._12_4_;
              auVar60._8_4_ = 0x7f800000;
              auVar60._0_8_ = 0x7f8000007f800000;
              auVar60._12_4_ = 0x7f800000;
              auVar33 = vblendvps_avx(auVar60,auVar40,local_10b8);
              local_fc8[0] = fVar54 * local_1028._0_4_;
              local_fc8[1] = fVar61 * local_1028._4_4_;
              local_fc8[2] = fVar62 * local_1028._8_4_;
              local_fc8[3] = fVar63 * local_1028._12_4_;
              auVar45 = vshufps_avx(auVar33,auVar33,0xb1);
              auVar45 = vminps_avx(auVar45,auVar33);
              auVar55 = vshufpd_avx(auVar45,auVar45,1);
              auVar45 = vminps_avx(auVar55,auVar45);
              auVar33 = vcmpps_avx(auVar33,auVar45,0);
              auVar55 = local_10b8 & auVar33;
              auVar45 = vpcmpeqd_avx(auVar45,auVar45);
              if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar55[0xf] < '\0') {
                auVar45 = auVar33;
              }
              lVar22 = lVar22 + uVar29;
              auVar33 = vandps_avx(local_10b8,auVar45);
              uVar18 = vmovmskps_avx(auVar33);
              lVar9 = 0;
              for (uVar19 = CONCAT44((int)((ulong)context >> 0x20),uVar18); (uVar19 & 1) == 0;
                  uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar9 = lVar9 + 1;
              }
              pRVar6 = (context->scene->geometries).items;
              uVar21 = *(uint *)(ray + k * 4 + 0x90);
              uVar48 = *(uint *)(lVar22 + 0x90 + lVar9 * 4);
              uVar49 = (pRVar6[uVar48].ptr)->mask;
              while ((uVar49 & uVar21) == 0) {
                *(undefined4 *)(local_10b8 + lVar9 * 4) = 0;
                if ((((local_10b8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_10b8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_10b8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_10b8[0xf]) goto LAB_004f499d;
                auVar52._8_4_ = 0x7f800000;
                auVar52._0_8_ = 0x7f8000007f800000;
                auVar52._12_4_ = 0x7f800000;
                auVar33 = vblendvps_avx(auVar52,auVar40,local_10b8);
                auVar45 = vshufps_avx(auVar33,auVar33,0xb1);
                auVar45 = vminps_avx(auVar45,auVar33);
                auVar55 = vshufpd_avx(auVar45,auVar45,1);
                auVar45 = vminps_avx(auVar55,auVar45);
                auVar45 = vcmpps_avx(auVar33,auVar45,0);
                auVar55 = local_10b8 & auVar45;
                auVar33 = local_10b8;
                if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar55[0xf] < '\0') {
                  auVar33 = vandps_avx(auVar45,local_10b8);
                }
                uVar19 = (ulong)lVar9 >> 0x20;
                uVar18 = vmovmskps_avx(auVar33);
                lVar9 = 0;
                for (uVar19 = CONCAT44((int)uVar19,uVar18); (uVar19 & 1) == 0;
                    uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                  lVar9 = lVar9 + 1;
                }
                uVar48 = *(uint *)(lVar22 + 0x90 + lVar9 * 4);
                uVar49 = (pRVar6[uVar48].ptr)->mask;
              }
              uVar19 = (ulong)(uint)((int)lVar9 << 2);
              uVar18 = *(undefined4 *)((long)local_fd8 + uVar19);
              uVar5 = *(undefined4 *)((long)local_fc8 + uVar19);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_fb8 + uVar19);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_fa8 + uVar19);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_f98 + uVar19);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_f88 + uVar19);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar18;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar22 + 0xa0 + uVar19);
              *(uint *)(ray + k * 4 + 0x120) = uVar48;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
          }
LAB_004f499d:
          lVar28 = lVar28 + 1;
        } while (lVar28 != uVar27 - 8);
      }
      uVar18 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar53 = ZEXT1664(CONCAT412(uVar18,CONCAT48(uVar18,CONCAT44(uVar18,uVar18))));
    }
    if (pauVar26 == (undefined1 (*) [16])&local_f78) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }